

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool FIX::double_conversion::ConsumeSubString<char_const*>(char **current,char *end,char *substring)

{
  char *local_28;
  char *substring_local;
  char *end_local;
  char **current_local;
  
  if (**current != *substring) {
    __assert_fail("**current == *substring",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x1a9,
                  "bool FIX::double_conversion::ConsumeSubString(Iterator *, Iterator, const char *) [Iterator = const char *]"
                 );
  }
  local_28 = substring + 1;
  while( true ) {
    if (*local_28 == '\0') {
      *current = *current + 1;
      return true;
    }
    *current = *current + 1;
    if ((*current == end) || (**current != *local_28)) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring) {
  ASSERT(**current == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || **current != *substring) return false;
  }
  ++*current;
  return true;
}